

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindReadCase::render
          (InvalidateSubFboUnbindReadCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int iVar1;
  DataType outputType;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  TextureFormat TVar5;
  Context *pCVar6;
  TransferFormat TVar7;
  ChannelOrder CVar8;
  deUint32 depthStencilTex;
  deUint32 colorTex;
  DataTypes local_408;
  deUint32 local_3e8;
  deUint32 fbo;
  TextureFormat colorFmt;
  Vec4 local_3d8;
  ulong local_3c0;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  ulong local_3a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec4 local_378;
  TextureFormatInfo colorFmtInfo;
  Texture2DShader texShader;
  GradientShader gradShader;
  
  colorFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    TVar5.order = CHANNELORDER_LAST;
    TVar5.type = SNORM_INT8;
    local_3c0 = 0x2600000000;
  }
  else {
    TVar5 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    local_3c0 = (ulong)TVar5 & 0xffffffff00000000;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  fbo = 0;
  colorTex = 0;
  depthStencilTex = 0;
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  local_3ac = sglr::ContextWrapper::getWidth(this_00);
  iVar1 = sglr::ContextWrapper::getHeight(this_00);
  local_3b4 = sglr::ContextWrapper::getWidth(this_00);
  local_3b0 = sglr::ContextWrapper::getHeight(this_00);
  outputType = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::GradientShader::GradientShader(&gradShader,outputType);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_3e8 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradShader);
  TVar7 = glu::getTransferFormat(colorFmt);
  sglr::ContextWrapper::glGenTextures(this_00,1,&colorTex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,colorTex);
  dVar4 = this->m_colorFmt;
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,dVar4,iVar2,iVar3,0,TVar7.format,TVar7.dataType,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  CVar8 = TVar5.order;
  local_3a8 = (ulong)TVar5 & 0xffffffff;
  if (this->m_depthStencilFmt != 0) {
    TVar7 = glu::getTransferFormat((TextureFormat)(local_3c0 | local_3a8));
    sglr::ContextWrapper::glGenTextures(this_00,1,&depthStencilTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,depthStencilTex);
    dVar4 = this->m_depthStencilFmt;
    iVar2 = sglr::ContextWrapper::getWidth(this_00);
    iVar3 = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,0,dVar4,iVar2,iVar3,0,TVar7.format,TVar7.dataType,(void *)0x0);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,colorTex,0);
  if ((CVar8 == DS) || (CVar8 == D)) {
    sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8d00,0xde1,depthStencilTex,0);
  }
  if (CVar8 - S < 2) {
    sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8d20,0xde1,depthStencilTex,0);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  texShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  FboTestCase::clearColorBuffer(&this->super_FboTestCase,&colorFmt,(Vec4 *)&texShader);
  sglr::ContextWrapper::glClear(this_00,0x500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar6,local_3e8,&colorFmtInfo.valueMin,&colorFmtInfo.valueMax);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  texShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0xbf800000bf800000;
  texShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(texShader.super_ShaderProgram.super_VertexShader.m_inputs.
                         super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xbf800000);
  local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_408.vec.
                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0x3f800000);
  sglr::drawQuad(pCVar6,local_3e8,(Vec3 *)&texShader,(Vec3 *)&local_408);
  iVar2 = local_3ac / 2;
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0,0,iVar2,iVar1);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  sglr::ContextWrapper::glClearColor(this_00,0.25,0.5,0.75,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glScissor(this_00,iVar2,0,local_3b4 / 2,local_3b0);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  if ((this->m_invalidateBuffers & 0x4000) == 0) {
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (DataType *)0x0;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (DataType *)0x0;
    local_3d8.m_data[0] = (float)glu::getSampler2DType((TextureFormat)(local_3c0 | local_3a8));
    if (local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::DataType,std::allocator<glu::DataType>>::
      _M_realloc_insert<glu::DataType_const&>
                ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_408,
                 (iterator)
                 local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(DataType *)&local_3d8);
    }
    else {
      *local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
       super__Vector_impl_data._M_finish = (DataType)local_3d8.m_data[0];
      local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_3d8.m_data[0] = 1.0;
    local_3d8.m_data[1] = 1.0;
    local_3d8.m_data[2] = 1.0;
    local_3d8.m_data[3] = 1.0;
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 0.0;
    local_378.m_data[2] = 0.0;
    local_378.m_data[3] = 0.0;
    FboTestUtil::Texture2DShader::Texture2DShader
              (&texShader,&local_408,TYPE_FLOAT_VEC4,&local_3d8,&local_378);
    if (local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.vec.
                      super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_408.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar4 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texShader);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar6,dVar4);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,depthStencilTex);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_408.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_3d8.m_data[0] = 1.0;
    local_3d8.m_data[1] = 1.0;
    local_3d8.m_data._8_8_ = local_3d8.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar6,dVar4,(Vec3 *)&local_408,(Vec3 *)&local_3d8);
  }
  else {
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (DataType *)0x0;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (DataType *)0x0;
    local_3d8.m_data[0] = (float)glu::getSampler2DType(colorFmt);
    if (local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::DataType,std::allocator<glu::DataType>>::
      _M_realloc_insert<glu::DataType_const&>
                ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_408,
                 (iterator)
                 local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(DataType *)&local_3d8);
    }
    else {
      *local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
       super__Vector_impl_data._M_finish = (DataType)local_3d8.m_data[0];
      local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_3d8.m_data[0] = 1.0;
    local_3d8.m_data[1] = 1.0;
    local_3d8.m_data[2] = 1.0;
    local_3d8.m_data[3] = 1.0;
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 0.0;
    local_378.m_data[2] = 0.0;
    local_378.m_data[3] = 0.0;
    FboTestUtil::Texture2DShader::Texture2DShader
              (&texShader,&local_408,TYPE_FLOAT_VEC4,&local_3d8,&local_378);
    if (local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.vec.
                      super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_408.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar4 = (*pCVar6->_vptr_Context[0x75])(pCVar6);
    FboTestUtil::Texture2DShader::setTexScaleBias
              (&texShader,0,&colorFmtInfo.lookupScale,&colorFmtInfo.lookupBias);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar6,dVar4);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,colorTex);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
    local_408.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_408.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_3d8.m_data[0] = 1.0;
    local_3d8.m_data[1] = 1.0;
    local_3d8.m_data._8_8_ = local_3d8.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar6,dVar4,(Vec3 *)&local_408,(Vec3 *)&local_3d8);
  }
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar1,iVar2);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorTex				= 0;
		deUint32				depthStencilTex			= 0;
		int						invalidateX				= 0;
		int						invalidateY				= 0;
		int						invalidateW				= getWidth()/2;
		int						invalidateH				= getHeight();
		int						readX					= invalidateW;
		int						readY					= 0;
		int						readW					= getWidth()/2;
		int						readH					= getHeight();
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);

		// Create fbo.
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(colorFmt);

			glGenTextures	(1, &colorTex);
			glBindTexture	(GL_TEXTURE_2D, colorTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_colorFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		if (m_depthStencilFmt != GL_NONE)
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(depthStencilFmt);

			glGenTextures	(1, &depthStencilTex);
			glBindTexture	(GL_TEXTURE_2D, depthStencilTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_depthStencilFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		glGenFramebuffers		(1, &fbo);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorTex, 0);

		if (depth)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		if (stencil)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		clearColorBuffer(colorFmt, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		glClear			(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		glBindFramebuffer	(GL_FRAMEBUFFER, 0);
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);

		glClearColor		(0.25f, 0.5f, 0.75f, 1.0f);
		glClear				(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Limit read area using scissor.
		glScissor			(readX, readY, readW, readH);
		glEnable			(GL_SCISSOR_TEST);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Render color.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(colorFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setTexScaleBias(0, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, colorTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}
		else
		{
			// Render depth.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(depthStencilFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, depthStencilTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}